

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

void setupMultiArrayFeature(FeatureDescription *feature,string *name)

{
  RepeatedField<long> *this;
  uint uVar1;
  ulong uVar2;
  FeatureType *this_00;
  ArrayFeatureType *pAVar3;
  long *plVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  
  uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar5);
  this_00 = feature->type_;
  if (this_00 == (FeatureType *)0x0) {
    uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar6);
    feature->type_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 5) {
    ((this_00->Type_).multiarraytype_)->datatype_ = 0x10020;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 5;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pAVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar6);
    (this_00->Type_).multiarraytype_ = pAVar3;
    this_00 = feature->type_;
    pAVar3->datatype_ = 0x10020;
    if (this_00 == (FeatureType *)0x0) {
      uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
      pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar6 = *(Arena **)pAVar6;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                          (pAVar6);
      feature->type_ = this_00;
    }
  }
  if (this_00->_oneof_case_[0] == 5) {
    pAVar3 = (this_00->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 5;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pAVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar6);
    (this_00->Type_).multiarraytype_ = pAVar3;
  }
  this = &pAVar3->shape_;
  uVar1 = (pAVar3->shape_).current_size_;
  if (uVar1 == (pAVar3->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 1);
    plVar4 = google::protobuf::RepeatedField<long>::elements(this);
    plVar4[uVar1] = 1;
  }
  else {
    plVar4 = google::protobuf::RepeatedField<long>::elements(this);
    plVar4[uVar1] = 1;
  }
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

static void setupMultiArrayFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    feature->mutable_type()->mutable_multiarraytype()->add_shape(1);
}